

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Result * __thiscall
testing::Action<std::experimental::fundamentals_v1::optional<InotifyEvent>_()>::Perform
          (Result *__return_storage_ptr__,
          Action<std::experimental::fundamentals_v1::optional<InotifyEvent>_()> *this,
          ArgumentTuple *args)

{
  bool bVar1;
  ActionInterface<std::experimental::fundamentals_v1::optional<InotifyEvent>_()> *pAVar2;
  allocator local_41;
  string local_40;
  ArgumentTuple *local_20;
  ArgumentTuple *args_local;
  Action<std::experimental::fundamentals_v1::optional<InotifyEvent>_()> *this_local;
  
  local_20 = args;
  args_local = (ArgumentTuple *)this;
  this_local = (Action<std::experimental::fundamentals_v1::optional<InotifyEvent>_()> *)
               __return_storage_ptr__;
  bVar1 = IsDoDefault(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_40,
             "You are using DoDefault() inside a composite action like DoAll() or WithArgs().  This is not supported for technical reasons.  Please instead spell out the default action, or assign the default action to an Action variable and use the variable in various places."
             ,&local_41);
  internal::Assert(!bVar1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/contrib/googletest-release-1.8.0/googlemock/include/gmock/gmock-actions.h"
                   ,0x185,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pAVar2 = internal::
           linked_ptr<testing::ActionInterface<std::experimental::fundamentals_v1::optional<InotifyEvent>_()>_>
           ::operator->(&this->impl_);
  (*pAVar2->_vptr_ActionInterface[2])(__return_storage_ptr__,pAVar2,local_20);
  return __return_storage_ptr__;
}

Assistant:

Result Perform(const ArgumentTuple& args) const {
    internal::Assert(
        !IsDoDefault(), __FILE__, __LINE__,
        "You are using DoDefault() inside a composite action like "
        "DoAll() or WithArgs().  This is not supported for technical "
        "reasons.  Please instead spell out the default action, or "
        "assign the default action to an Action variable and use "
        "the variable in various places.");
    return impl_->Perform(args);
  }